

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O0

void lnode_print_version(int flags)

{
  char *pcVar1;
  size_t sVar2;
  char local_1028 [8];
  char buffer [4096];
  int flags_local;
  
  memset(local_1028,0,0x1000);
  pcVar1 = uv_version_string();
  sprintf(local_1028,"v%d.%d.%d (Lua %s.%s.%s, libuv %s, build %s %s)",0,8,0x10,"5","3","4",pcVar1,
          "May  2 2025","14:34:25");
  sVar2 = strlen(local_1028);
  fwrite(local_1028,1,sVar2,_stdout);
  fwrite("\n",1,1,_stdout);
  fflush(_stdout);
  sprintf(local_1028,
          "\nusage: lnode [options] [ -e script | script.lua [arguments]]\n\noptions:\n\n  -d  run as daemon\n  -e  evaluate script\n  -l  print path information\n  -p  evaluate script and print result\t\n  -r  module to preload\n  -v  print Node.lua version\n  -   load script from stdin\n\n"
         );
  if ((flags & 1U) != 0) {
    sVar2 = strlen(local_1028);
    fwrite(local_1028,1,sVar2,_stdout);
    fwrite("\n",1,1,_stdout);
    fflush(_stdout);
  }
  return;
}

Assistant:

LUALIB_API int lnode_print_version()
{
    char buffer[PATH_MAX];
    memset(buffer, 0, sizeof(buffer));

#ifdef WITH_INIT
    sprintf(buffer, "lnode %d.%d.%s (Lua %s.%s.%s, libuv %s, build %s %s)",
            LNODE_MAJOR_VERSION, LNODE_MINOR_VERSION, core_build,
            LUA_VERSION_MAJOR, LUA_VERSION_MINOR, LUA_VERSION_RELEASE,
            uv_version_string(), __DATE__, __TIME__);
#else
    sprintf(buffer, "lnode %d.%d (Lua %s.%s.%s, libuv %s, build %s %s)",
            LNODE_MAJOR_VERSION, LNODE_MINOR_VERSION,
            LUA_VERSION_MAJOR, LUA_VERSION_MINOR, LUA_VERSION_RELEASE,
            uv_version_string(), __DATE__, __TIME__);
#endif

    lua_writestring(buffer, strlen(buffer));
    lua_writeline();

    return 0;
}